

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O0

bool __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lk;
  shared_mutex_base<yamc::rwlock::WriterPrefer> *this_local;
  
  lk._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mtx_);
  bVar1 = rwlock::WriterPrefer::wait_rlock(&this->state_);
  if (!bVar1) {
    rwlock::WriterPrefer::acquire_rlock(&this->state_);
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return this_local._7_1_;
}

Assistant:

bool try_lock_shared()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    return true;
  }